

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetWindowHitTestHole(ImGuiWindow *window,ImVec2 *pos,ImVec2 *size)

{
  if ((window->HitTestHoleSize).x == 0) {
    window->HitTestHoleSize = (ImVec2ih)((int)size->x & 0xffffU | (int)size->y << 0x10);
    window->HitTestHoleOffset =
         (ImVec2ih)
         ((int)(pos->x - (window->Pos).x) & 0xffffU | (int)(pos->y - (window->Pos).y) << 0x10);
    return;
  }
  __assert_fail("window->HitTestHoleSize.x == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                ,0x1987,
                "void ImGui::SetWindowHitTestHole(ImGuiWindow *, const ImVec2 &, const ImVec2 &)");
}

Assistant:

void ImGui::SetWindowHitTestHole(ImGuiWindow* window, const ImVec2& pos, const ImVec2& size)
{
    IM_ASSERT(window->HitTestHoleSize.x == 0);     // We don't support multiple holes/hit test filters
    window->HitTestHoleSize = ImVec2ih(size);
    window->HitTestHoleOffset = ImVec2ih(pos - window->Pos);
}